

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O3

void __thiscall BBDT<RemSP>::PerformLabeling(BBDT<RemSP> *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Mat1b *pMVar6;
  Mat1i *pMVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined4 uVar17;
  ulong uVar18;
  int iVar20;
  uint uVar21;
  uint *puVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  uint local_e8;
  Mat local_90 [96];
  ulong uVar19;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar12 = *(uint *)&pMVar6->field_0x8;
  uVar11 = (ulong)uVar12;
  iVar20 = *(int *)&pMVar6->field_0xc;
  lVar27 = (long)iVar20;
  cv::Mat::Mat(local_90,**(int **)&pMVar6->field_0x40,(*(int **)&pMVar6->field_0x40)[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar3 = *(int *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  RemSP::P_ = (uint *)operator_new__((ulong)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
                                             ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  uVar9 = 1;
  if (0 < (int)uVar12) {
    uVar18 = 0;
    do {
      if (0 < iVar20) {
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar13 = **(long **)&pMVar6->field_0x48;
        lVar15 = lVar13 * uVar18 + *(long *)&pMVar6->field_0x10;
        lVar28 = lVar15 - lVar13;
        lVar23 = lVar28 - lVar13;
        lVar24 = **(long **)&pMVar7->field_0x48;
        lVar29 = lVar24 * uVar18 + *(long *)&pMVar7->field_0x10;
        lVar13 = lVar13 + lVar15;
        lVar24 = lVar29 + lVar24 * -2;
        uVar25 = uVar18 | 1;
        uVar32 = 0;
        do {
          if (*(char *)(lVar15 + uVar32) == '\0') {
            if ((uVar25 < uVar11) && (*(char *)(lVar13 + uVar32) != '\0')) {
              uVar10 = uVar32 | 1;
              if ((lVar27 <= (long)uVar10) || (*(char *)(lVar15 + uVar10) == '\0')) {
                if ((uVar32 != 0) &&
                   ((*(char *)((uVar32 - 1) + lVar13) != '\0' ||
                    (*(char *)(lVar15 + -1 + uVar32) != '\0')))) goto LAB_0019945e;
                goto LAB_0019916e;
              }
              if (uVar32 == 0) {
LAB_00198e63:
                if (uVar18 == 0) goto LAB_0019916e;
                if (*(char *)(lVar28 + (uVar32 | 1)) == '\0') {
                  if (((long)(uVar32 + 2) < lVar27) && (*(char *)(lVar28 + uVar32 + 2) != '\0')) {
                    if (*(char *)(lVar28 + uVar32) == '\0') goto LAB_00199213;
                    goto LAB_00199014;
                  }
                  if (*(char *)(lVar28 + uVar32) == '\0') goto LAB_0019916e;
                }
                goto LAB_00199165;
              }
              if (*(char *)((uVar32 - 1) + lVar15) != '\0') {
                if (uVar18 != 0) {
                  if (*(char *)(lVar28 + uVar10) != '\0') goto LAB_00198d98;
                  if (((long)(uVar32 + 2) < lVar27) && (*(char *)(lVar28 + uVar32 + 2) != '\0')) {
                    if (*(char *)(lVar23 + uVar10) != '\0') {
                      if (*(char *)(lVar28 + uVar32) == '\0') goto LAB_00198eee;
                      goto LAB_001993c4;
                    }
                    uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
LAB_001994b8:
                    uVar9 = RemSP::Merge(uVar9,*(uint *)(lVar29 + -8 + uVar32 * 4));
LAB_001994d1:
                    *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                    goto LAB_00199467;
                  }
                }
                goto LAB_0019945e;
              }
              if (*(char *)(lVar13 + -1 + uVar32) == '\0') goto LAB_00198e63;
              if (uVar18 != 0) {
                if (*(char *)(lVar28 + uVar10) == '\0') {
                  if (((long)(uVar32 + 2) < lVar27) && (*(char *)(lVar28 + uVar32 + 2) != '\0')) {
                    if (*(char *)(lVar23 + uVar10) != '\0') {
                      if ((*(char *)((uVar32 - 2) + lVar15) == '\0') ||
                         ((*(char *)(lVar28 + -1 + uVar32) == '\0' &&
                          ((*(char *)(lVar28 + -2 + uVar32) == '\0' ||
                           (*(char *)(lVar23 + -1 + uVar32) == '\0')))))) goto LAB_001995fd;
                      if (*(char *)(lVar28 + uVar32) == '\0') {
                        cVar2 = *(char *)(lVar23 + uVar32);
                        goto joined_r0x00199373;
                      }
LAB_00199249:
                      uVar9 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                      goto LAB_00199616;
                    }
                    if (*(char *)(lVar28 + uVar32) == '\0') goto LAB_001995c5;
                    if (*(char *)((uVar32 - 2) + lVar15) == '\0') {
LAB_00199652:
                      uVar9 = RemSP::Merge(*(uint *)(lVar24 + uVar32 * 4),
                                           *(uint *)(lVar24 + 8 + uVar32 * 4));
                      uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                    }
                    else {
                      if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                        if (*(char *)(lVar28 + -2 + uVar32) != '\0') {
                          cVar2 = *(char *)(lVar23 + -1 + uVar32);
                          goto joined_r0x00199647;
                        }
                        goto LAB_00199652;
                      }
                      uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                      uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                    }
                    uVar9 = RemSP::Merge(uVar9,uVar21);
                    *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                    goto LAB_00199467;
                  }
                  if (*(char *)(lVar28 + uVar32) != '\0') {
                    if (*(char *)((uVar32 - 2) + lVar15) != '\0') {
                      if (*(char *)(lVar28 + -1 + uVar32) == '\0') goto LAB_00199231;
                      goto LAB_001993c4;
                    }
                    goto LAB_001993ce;
                  }
                }
                else {
                  if (*(char *)((uVar32 - 2) + lVar15) == '\0') {
LAB_001993ce:
                    uVar9 = *(uint *)(lVar24 + uVar32 * 4);
                    goto LAB_001994b8;
                  }
                  if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                    if ((*(char *)(lVar28 + -2 + uVar32) == '\0') ||
                       (*(char *)(lVar23 + -1 + uVar32) == '\0')) goto LAB_00199441;
                    if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_00199249;
                    bVar33 = *(char *)(lVar23 + uVar32) == '\0';
                  }
                  else {
                    if (*(char *)(lVar28 + uVar32) != '\0') {
LAB_001993c4:
                      uVar9 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                      goto LAB_001994d1;
                    }
                    bVar33 = *(char *)(lVar23 + uVar32) == '\0';
                  }
LAB_00199454:
                  if (bVar33) goto LAB_0019925f;
                }
              }
LAB_0019945e:
              uVar9 = *(uint *)(lVar29 + -8 + uVar32 * 4);
              goto LAB_00199463;
            }
            uVar10 = uVar32 | 1;
            if ((long)uVar10 < lVar27) {
              if (*(char *)(lVar15 + uVar10) != '\0') goto LAB_00198e63;
              if ((uVar25 < uVar11) && (*(char *)(lVar13 + uVar10) != '\0')) goto LAB_0019916e;
            }
            *(undefined4 *)(lVar29 + uVar32 * 4) = 0;
          }
          else {
            if (uVar32 == 0) {
LAB_00198f88:
              uVar10 = uVar32 | 1;
              if ((uVar18 == 0) ||
                 ((lVar27 <= (long)uVar10 || (*(char *)(lVar28 + uVar10) == '\0')))) {
                if (((long)uVar10 < lVar27) && (*(char *)(lVar15 + uVar10) != '\0')) {
                  if ((uVar18 == 0) || (lVar27 <= (long)(uVar32 + 2))) {
                    if (uVar18 == 0) goto LAB_0019916e;
                  }
                  else if (*(char *)(lVar28 + uVar32 + 2) != '\0') {
                    if (*(char *)(lVar28 + uVar32) == '\0') {
                      if ((uVar32 != 0) && (*(char *)(lVar28 + -1 + uVar32) != '\0')) {
                        if ((*(char *)(lVar23 + uVar10) == '\0') ||
                           (*(char *)(lVar23 + uVar32) == '\0')) {
                          uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                          uVar21 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                          goto LAB_00199607;
                        }
                        uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                        goto LAB_00199616;
                      }
                    }
                    else {
LAB_00199014:
                      if (*(char *)(lVar23 + (uVar32 | 1)) == '\0') {
                        uVar9 = *(uint *)(lVar24 + uVar32 * 4);
                        uVar21 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                        goto LAB_00199268;
                      }
                    }
LAB_00199213:
                    uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                    goto LAB_00199463;
                  }
                  if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_00199165;
                  if (uVar18 != 0 && uVar32 != 0) goto LAB_001990b7;
                }
                else if (uVar18 != 0) {
                  if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_00199165;
                  if (uVar32 == 0) goto LAB_0019916e;
LAB_001990b7:
                  if (*(char *)(lVar28 + -1 + uVar32) != '\0') {
                    uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                    goto LAB_00199463;
                  }
                }
LAB_0019916e:
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar9 = RemSP::length_ + 1;
                *(uint *)(lVar29 + uVar32 * 4) = RemSP::length_;
                RemSP::length_ = uVar9;
                goto LAB_00199467;
              }
              if ((((*(char *)(lVar28 + uVar32) == '\0') && (uVar32 != 0)) &&
                  (*(char *)(lVar28 + -1 + uVar32) != '\0')) && (*(char *)(lVar23 + uVar32) == '\0')
                 ) {
                uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                uVar21 = *(uint *)(lVar24 + uVar32 * 4);
                goto LAB_00199268;
              }
LAB_00199165:
              uVar9 = *(uint *)(lVar24 + uVar32 * 4);
            }
            else {
              if (*(char *)(lVar15 + -1 + uVar32) != '\0') {
                uVar10 = uVar32 | 1;
                if (((uVar18 == 0) || (lVar27 <= (long)uVar10)) ||
                   (*(char *)(lVar28 + uVar10) == '\0')) {
                  if ((((long)uVar10 < lVar27) && (*(char *)(lVar15 + uVar10) != '\0')) &&
                     ((uVar18 != 0 &&
                      (((long)(uVar32 + 2) < lVar27 && (*(char *)(lVar28 + uVar32 + 2) != '\0'))))))
                  {
                    if (*(char *)(lVar23 + uVar10) != '\0') {
                      if (*(char *)(lVar28 + uVar32) != '\0') goto LAB_00199249;
LAB_00198eee:
                      if ((*(char *)(lVar23 + uVar32) != '\0') &&
                         ((*(char *)(lVar28 + -1 + uVar32) != '\0' ||
                          ((*(char *)((uVar32 - 2) + lVar28) != '\0' &&
                           (*(char *)(lVar23 + -1 + uVar32) != '\0')))))) goto LAB_00199249;
                    }
LAB_001995fd:
                    uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                    goto LAB_00199602;
                  }
                }
                else {
LAB_00198d98:
                  if (*(char *)(lVar28 + uVar32) == '\0') {
                    if (*(char *)(lVar23 + uVar32) != '\0') {
                      if (*(char *)(lVar28 + -1 + uVar32) != '\0') goto LAB_00199249;
                      cVar2 = *(char *)((uVar32 - 2) + lVar28);
joined_r0x00198dc1:
                      if ((cVar2 != '\0') && (*(char *)(lVar23 + -1 + uVar32) != '\0'))
                      goto LAB_00199249;
                    }
LAB_00199441:
                    uVar9 = *(uint *)(lVar24 + uVar32 * 4);
LAB_00199602:
                    uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
LAB_00199607:
                    uVar9 = RemSP::Merge(uVar9,uVar21);
LAB_00199616:
                    *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                    goto LAB_00199467;
                  }
                }
                goto LAB_0019945e;
              }
              if ((uVar11 <= uVar25) || (*(char *)(lVar13 + -1 + uVar32) == '\0'))
              goto LAB_00198f88;
              uVar10 = uVar32 | 1;
              if (((uVar18 == 0) || (lVar27 <= (long)uVar10)) ||
                 (*(char *)(lVar28 + uVar10) == '\0')) {
                if (((lVar27 <= (long)uVar10) || (*(char *)(lVar15 + uVar10) == '\0')) ||
                   ((uVar18 == 0 ||
                    ((lVar27 <= (long)(uVar32 + 2) || (*(char *)(lVar28 + uVar32 + 2) == '\0'))))))
                {
                  if (uVar18 != 0) {
                    if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                      if (*(char *)(lVar28 + uVar32) != '\0') {
                        if (*(char *)((uVar32 - 2) + lVar15) != '\0') {
LAB_00199231:
                          cVar2 = *(char *)(lVar28 + -2 + uVar32);
                          goto joined_r0x00198dc1;
                        }
                        goto LAB_0019925f;
                      }
                    }
                    else if (*(char *)((uVar32 - 2) + lVar15) == '\0') {
                      uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                      goto LAB_00199263;
                    }
                  }
                  goto LAB_0019945e;
                }
                if (*(char *)((uVar32 - 2) + lVar15) != '\0') {
                  if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                    if (*(char *)(lVar23 + uVar10) != '\0') {
                      if ((*(char *)(lVar28 + -2 + uVar32) == '\0') ||
                         (*(char *)(lVar23 + -1 + uVar32) == '\0')) {
                        uVar9 = RemSP::Merge(*(uint *)(lVar24 + 8 + uVar32 * 4),
                                             *(uint *)(lVar29 + -8 + uVar32 * 4));
                      }
                      else {
                        if (*(char *)(lVar28 + uVar32) == '\0') {
                          cVar2 = *(char *)(lVar23 + uVar32);
                          goto joined_r0x00199373;
                        }
                        uVar9 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                      }
                      *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                      goto LAB_00199467;
                    }
                    if (*(char *)(lVar28 + uVar32) != '\0') {
                      if (*(char *)(lVar28 + -2 + uVar32) == '\0') {
                        uVar9 = *(uint *)(lVar24 + uVar32 * 4);
                        goto LAB_001995d3;
                      }
                      cVar2 = *(char *)(lVar23 + -1 + uVar32);
                      goto joined_r0x00199647;
                    }
                  }
                  else if (*(char *)(lVar23 + uVar10) != '\0') {
                    if (*(char *)(lVar28 + uVar32) == '\0') {
                      cVar2 = *(char *)(lVar23 + uVar32);
joined_r0x00199373:
                      if (cVar2 == '\0') goto LAB_001995c5;
                    }
                    goto LAB_0019945e;
                  }
LAB_001995c5:
                  uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                  goto LAB_00199263;
                }
                if (*(char *)(lVar28 + uVar32) != '\0') {
                  cVar2 = *(char *)(lVar23 + uVar10);
joined_r0x00199647:
                  if (cVar2 != '\0') {
LAB_00199395:
                    uVar9 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                    goto LAB_0019939a;
                  }
                  uVar9 = *(uint *)(lVar24 + uVar32 * 4);
LAB_00199545:
                  uVar21 = *(uint *)(lVar24 + 8 + uVar32 * 4);
                  goto LAB_0019954a;
                }
                if (*(char *)(lVar28 + -1 + uVar32) == '\0') goto LAB_001995c5;
                if (*(char *)(lVar23 + uVar10) != '\0') {
                  if (*(char *)(lVar23 + uVar32) != '\0') goto LAB_00199395;
                  uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                  goto LAB_00199545;
                }
                uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
LAB_001995d3:
                uVar9 = RemSP::Merge(uVar9,*(uint *)(lVar24 + 8 + uVar32 * 4));
                uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
              }
              else {
                if (*(char *)((uVar32 - 2) + lVar15) == '\0') {
                  if ((*(char *)(lVar28 + uVar32) == '\0') &&
                     (*(char *)(lVar28 + -1 + uVar32) != '\0')) {
                    if (*(char *)(lVar23 + uVar32) == '\0') {
                      uVar9 = *(uint *)(lVar24 + -8 + uVar32 * 4);
                      uVar21 = *(uint *)(lVar24 + uVar32 * 4);
LAB_0019954a:
                      uVar9 = RemSP::Merge(uVar9,uVar21);
                      uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                    }
                    else {
                      uVar9 = *(uint *)(lVar24 + uVar32 * 4);
LAB_0019939a:
                      uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                    }
                    uVar9 = RemSP::Merge(uVar9,uVar21);
                    *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                    goto LAB_00199467;
                  }
                }
                else {
                  if (*(char *)(lVar28 + -1 + uVar32) == '\0') {
                    if ((*(char *)(lVar28 + -2 + uVar32) == '\0') ||
                       (*(char *)(lVar23 + -1 + uVar32) == '\0')) {
                      uVar9 = RemSP::Merge(*(uint *)(lVar24 + uVar32 * 4),
                                           *(uint *)(lVar29 + -8 + uVar32 * 4));
                    }
                    else {
                      if (*(char *)(lVar28 + uVar32) == '\0') {
                        bVar33 = *(char *)(lVar23 + uVar32) == '\0';
                        goto LAB_00199454;
                      }
                      uVar9 = *(uint *)(lVar29 + -8 + uVar32 * 4);
                    }
                    *(uint *)(lVar29 + uVar32 * 4) = uVar9;
                    goto LAB_00199467;
                  }
                  if ((*(char *)(lVar28 + uVar32) != '\0') || (*(char *)(lVar23 + uVar32) != '\0'))
                  goto LAB_0019945e;
                }
LAB_0019925f:
                uVar9 = *(uint *)(lVar24 + uVar32 * 4);
LAB_00199263:
                uVar21 = *(uint *)(lVar29 + -8 + uVar32 * 4);
              }
LAB_00199268:
              uVar9 = RemSP::Merge(uVar9,uVar21);
            }
LAB_00199463:
            *(uint *)(lVar29 + uVar32 * 4) = uVar9;
          }
LAB_00199467:
          uVar32 = uVar32 + 2;
        } while ((long)uVar32 < lVar27);
      }
      puVar22 = RemSP::P_;
      uVar18 = uVar18 + 2;
    } while ((int)uVar18 < (int)uVar12);
    uVar9 = 1;
    if (1 < RemSP::length_) {
      uVar9 = 1;
      uVar11 = 1;
      do {
        if (puVar22[uVar11] < uVar11) {
          uVar12 = puVar22[puVar22[uVar11]];
        }
        else {
          uVar12 = uVar9;
          uVar9 = uVar9 + 1;
        }
        puVar22[uVar11] = uVar12;
        uVar11 = uVar11 + 1;
      } while (uVar11 < RemSP::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  puVar22 = RemSP::P_;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar12 = *(uint *)&pMVar7->field_0x8;
  uVar21 = uVar12 & 0xfffffffe;
  uVar9 = *(uint *)&pMVar7->field_0xc;
  local_e8 = uVar9 & 0x80000001;
  uVar18 = (long)(int)uVar9 & 0xfffffffffffffffe;
  uVar11 = 0;
  iVar20 = (int)uVar18;
  if (0 < (int)uVar21) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar24 = *(long *)&pMVar6->field_0x10;
    lVar15 = **(long **)&pMVar6->field_0x48;
    lVar23 = *(long *)&pMVar7->field_0x10;
    lVar28 = **(long **)&pMVar7->field_0x48;
    lVar27 = lVar23 + lVar28;
    lVar13 = lVar24 + 1 + lVar15;
    lVar14 = lVar24 + 1;
    uVar25 = 0;
    lVar29 = lVar23;
    do {
      puVar8 = RemSP::P_;
      lVar16 = lVar28 * uVar25 + lVar23;
      lVar1 = lVar16 + lVar28;
      if (iVar20 < 1) {
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        do {
          lVar30 = (long)*(int *)(lVar29 + uVar32 * 4);
          if (lVar30 < 1) {
            *(undefined8 *)(lVar29 + uVar32 * 4) = 0;
            uVar10 = uVar32 + 1;
            *(undefined4 *)(lVar27 + uVar32 * 4) = 0;
            uVar17 = 0;
          }
          else {
            uVar5 = puVar8[lVar30];
            uVar26 = uVar5;
            if (*(char *)(lVar14 + -1 + uVar32) == '\0') {
              uVar26 = 0;
            }
            *(uint *)(lVar29 + uVar32 * 4) = uVar26;
            uVar10 = uVar32 | 1;
            uVar26 = uVar5;
            if (*(char *)(lVar14 + uVar32) == '\0') {
              uVar26 = 0;
            }
            *(uint *)(lVar29 + 4 + uVar32 * 4) = uVar26;
            uVar26 = uVar5;
            if (*(char *)(lVar13 + -1 + uVar32) == '\0') {
              uVar26 = 0;
            }
            *(uint *)(lVar27 + uVar32 * 4) = uVar26;
            uVar19 = (ulong)uVar5;
            if (*(char *)(lVar13 + uVar32) == '\0') {
              uVar19 = uVar11;
            }
            uVar17 = (undefined4)uVar19;
          }
          *(undefined4 *)(lVar1 + uVar10 * 4) = uVar17;
          uVar32 = uVar32 + 2;
        } while ((long)uVar32 < (long)uVar18);
      }
      if (local_e8 == 1) {
        lVar30 = (long)*(int *)(lVar16 + uVar32 * 4);
        if (lVar30 < 1) {
          *(undefined4 *)(lVar16 + uVar32 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar32 * 4) = 0;
        }
        else {
          lVar31 = lVar15 * uVar25 + lVar24;
          uVar5 = puVar22[lVar30];
          uVar10 = (ulong)uVar5;
          if (*(char *)(lVar31 + uVar32) == '\0') {
            uVar10 = uVar11;
          }
          *(int *)(lVar16 + uVar32 * 4) = (int)uVar10;
          if (*(char *)(lVar31 + lVar15 + uVar32) == '\0') {
            *(undefined4 *)(lVar1 + uVar32 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar32 * 4) = uVar5;
          }
        }
      }
      uVar25 = uVar25 + 2;
      lVar27 = lVar27 + lVar28 * 2;
      lVar13 = lVar13 + lVar15 * 2;
      lVar14 = lVar14 + lVar15 * 2;
      lVar29 = lVar29 + lVar28 * 2;
    } while (uVar25 < uVar21);
    uVar11 = uVar25 & 0xffffffff;
  }
  puVar22 = RemSP::P_;
  if ((uVar12 & 0x80000001) == 1) {
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar27 = *(long *)&pMVar6->field_0x10;
    lVar15 = **(long **)&pMVar6->field_0x48 * uVar11;
    lVar13 = *(long *)&pMVar7->field_0x10;
    lVar24 = uVar11 * **(long **)&pMVar7->field_0x48;
    if (iVar20 < 1) {
      uVar11 = 0;
    }
    else {
      lVar23 = lVar15 + lVar27;
      lVar28 = lVar24 + lVar13;
      uVar11 = 0;
      do {
        lVar29 = (long)*(int *)(lVar28 + uVar11 * 4);
        if (lVar29 < 1) {
          *(undefined8 *)(lVar28 + uVar11 * 4) = 0;
        }
        else {
          uVar12 = puVar22[lVar29];
          uVar21 = uVar12;
          if (*(char *)(lVar23 + uVar11) == '\0') {
            uVar21 = 0;
          }
          *(uint *)(lVar28 + uVar11 * 4) = uVar21;
          if (*(char *)(lVar23 + 1 + uVar11) == '\0') {
            *(undefined4 *)(lVar28 + 4 + uVar11 * 4) = 0;
          }
          else {
            *(uint *)(lVar28 + 4 + uVar11 * 4) = uVar12;
          }
        }
        uVar11 = uVar11 + 2;
      } while (uVar11 < ((long)(int)uVar9 & 0xfffffffeU));
    }
    puVar22 = RemSP::P_;
    if (local_e8 == 1) {
      lVar13 = lVar13 + lVar24;
      lVar24 = (long)*(int *)(lVar13 + uVar11 * 4);
      if ((0 < lVar24) && (*(char *)(lVar27 + lVar15 + uVar11) != '\0')) {
        *(uint *)(lVar13 + uVar11 * 4) = RemSP::P_[lVar24];
        goto LAB_00199988;
      }
      *(undefined4 *)(lVar13 + uVar11 * 4) = 0;
    }
  }
  puVar22 = RemSP::P_;
  if (RemSP::P_ == (uint *)0x0) {
    return;
  }
LAB_00199988:
  operator_delete__(puVar22);
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }